

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Abc_NtkFxPerform(Abc_Ntk_t *pNtk,int nNewNodesMax,int LitCountMax,int fCanonDivs,int fVerbose,
                    int fVeryVerbose)

{
  int iVar1;
  Vec_Wec_t *vCubes_00;
  Vec_Wec_t *vCubes;
  int fVeryVerbose_local;
  int fVerbose_local;
  int fCanonDivs_local;
  int LitCountMax_local;
  int nNewNodesMax_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsSopLogic(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkFxCheck(pNtk);
    if (iVar1 == 0) {
      printf("Abc_NtkFastExtract: Nodes have duplicated fanins. FX is not performed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      vCubes_00 = Abc_NtkFxRetrieve(pNtk);
      iVar1 = Abc_NtkObjNumMax(pNtk);
      iVar1 = Fx_FastExtract(vCubes_00,iVar1,nNewNodesMax,LitCountMax,fCanonDivs,fVerbose,
                             fVeryVerbose);
      if (iVar1 < 1) {
        printf("Warning: The network has not been changed by \"fx\".\n");
        Vec_WecFree(vCubes_00);
        pNtk_local._4_4_ = 0;
      }
      else {
        Abc_NtkFxInsert(pNtk,vCubes_00);
        Vec_WecFree(vCubes_00);
        iVar1 = Abc_NtkCheck(pNtk);
        if (iVar1 == 0) {
          printf("Abc_NtkFxPerform: The network check has failed.\n");
        }
        pNtk_local._4_4_ = 1;
      }
    }
    return pNtk_local._4_4_;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                ,0x136,"int Abc_NtkFxPerform(Abc_Ntk_t *, int, int, int, int, int)");
}

Assistant:

int Abc_NtkFxPerform( Abc_Ntk_t * pNtk, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    extern int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose );
    Vec_Wec_t * vCubes;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // check unique fanins
    if ( !Abc_NtkFxCheck(pNtk) )
    {
        printf( "Abc_NtkFastExtract: Nodes have duplicated fanins. FX is not performed.\n" );
        return 0;
    }
    // collect information about the covers
    vCubes = Abc_NtkFxRetrieve( pNtk );
    // call the fast extract procedure
    if ( Fx_FastExtract( vCubes, Abc_NtkObjNumMax(pNtk), nNewNodesMax, LitCountMax, fCanonDivs, fVerbose, fVeryVerbose ) > 0 )
    {
        // update the network
        Abc_NtkFxInsert( pNtk, vCubes );
        Vec_WecFree( vCubes );
        if ( !Abc_NtkCheck( pNtk ) )
            printf( "Abc_NtkFxPerform: The network check has failed.\n" );
        return 1;
    }
    else
        printf( "Warning: The network has not been changed by \"fx\".\n" );
    Vec_WecFree( vCubes );
    return 0;
}